

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_MtDecoder_AssignHasbits(upb_MtDecoder *d)

{
  ushort uVar1;
  upb_MiniTable *puVar2;
  upb_MiniTableField *puVar3;
  ulong uVar4;
  uint16_t uVar5;
  long lVar6;
  short sVar7;
  
  puVar2 = d->table;
  uVar1 = puVar2->field_count_dont_copy_me__upb_internal_use_only;
  if (uVar1 == 0) {
    uVar4 = 0x3f;
  }
  else {
    puVar3 = puVar2->fields_dont_copy_me__upb_internal_use_only;
    uVar4 = 0x3f;
    lVar6 = 0;
    do {
      sVar7 = *(short *)((long)&puVar3->offset_dont_copy_me__upb_internal_use_only + lVar6);
      if (sVar7 == 0) {
LAB_00308694:
        *(short *)((long)&puVar3->presence + lVar6) = sVar7;
      }
      else if (sVar7 == 2) {
        uVar4 = uVar4 + 1;
        sVar7 = (short)uVar4;
        goto LAB_00308694;
      }
      lVar6 = lVar6 + 0xc;
    } while ((ulong)((uint)uVar1 * 4) * 3 != lVar6);
  }
  if (0x7f < uVar4) {
    upb_MdDecoder_ErrorJmp(&d->base,"Too many required fields");
  }
  puVar2->required_count_dont_copy_me__upb_internal_use_only = (char)uVar4 + 0xc1;
  if (uVar1 != 0) {
    puVar3 = puVar2->fields_dont_copy_me__upb_internal_use_only;
    lVar6 = 0;
    do {
      if (*(short *)((long)&puVar3->offset_dont_copy_me__upb_internal_use_only + lVar6) == 1) {
        uVar4 = uVar4 + 1;
        *(short *)((long)&puVar3->presence + lVar6) = (short)uVar4;
      }
      lVar6 = lVar6 + 0xc;
    } while ((ulong)uVar1 * 0xc != lVar6);
  }
  uVar5 = 0;
  if (uVar4 != 0) {
    uVar5 = (uint16_t)((int)uVar4 + 8U >> 3);
  }
  puVar2->size_dont_copy_me__upb_internal_use_only = uVar5;
  return;
}

Assistant:

static void upb_MtDecoder_AssignHasbits(upb_MtDecoder* d) {
  upb_MiniTable* ret = d->table;
  int n = ret->UPB_PRIVATE(field_count);
  size_t last_hasbit = kUpb_Reserved_Hasbits - 1;

  // First assign required fields, which must have the lowest hasbits.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kRequiredPresence) {
      field->presence = ++last_hasbit;
    } else if (field->UPB_PRIVATE(offset) == kNoPresence) {
      field->presence = 0;
    }
  }
  if (last_hasbit > kUpb_Reserved_Hasbits + 63) {
    upb_MdDecoder_ErrorJmp(&d->base, "Too many required fields");
  }

  ret->UPB_PRIVATE(required_count) = last_hasbit - (kUpb_Reserved_Hasbits - 1);

  // Next assign non-required hasbit fields.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kHasbitPresence) {
      field->presence = ++last_hasbit;
    }
  }

  ret->UPB_PRIVATE(size) =
      last_hasbit ? upb_MiniTable_DivideRoundUp(last_hasbit + 1, 8) : 0;
}